

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.hpp
# Opt level: O3

void __thiscall
tcu::ThreadUtil::Operation::modifyObject(Operation *this,SharedPtr<tcu::ThreadUtil::Object> *object)

{
  deInt32 *pdVar1;
  Object *this_00;
  SharedPtr<tcu::ThreadUtil::Event> local_18;
  
  this_00 = object->m_ptr;
  local_18.m_ptr = (this->m_event).m_ptr;
  local_18.m_state = (this->m_event).m_state;
  if (local_18.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_18.m_state)->strongRefCount = (local_18.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_18.m_state)->weakRefCount = (local_18.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Object::modify(this_00,&local_18,&this->m_deps);
  if (local_18.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_18.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_18.m_ptr = (Event *)0x0;
      (*(local_18.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_18.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_18.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_18.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

void									modifyObject	(de::SharedPtr<Object> object) { object->modify(m_event, m_deps); }